

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

void genIR(void)

{
  char cVar1;
  ast *paVar2;
  ast *paVar3;
  ast *paVar4;
  char *pcVar5;
  long *plVar6;
  size_type *psVar7;
  ofstream out;
  undefined1 local_290 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  int local_268;
  ast *local_260;
  ast *local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  _Alloc_hider local_220;
  char local_210 [32];
  _Alloc_hider local_1f0;
  char local_1e0 [32];
  _Alloc_hider local_1c0;
  char local_1b0 [120];
  ios_base local_138 [264];
  
  paVar2 = child(ast_root,1);
  if (paVar2 != (ast *)0x0) {
    do {
      if (paVar2->type == -1) break;
      local_258 = paVar2;
      local_260 = child(paVar2,1);
      paVar3 = child(local_260,2);
      paVar4 = child(paVar3,1);
      paVar2 = child(paVar3,3);
      if (paVar3->type != -0x2707) {
        std::operator<<((ostream *)&std::cerr,"Global definition or structure not implemented!\n");
        exit(1);
      }
      local_290._0_4_ = 1;
      std::__cxx11::string::string((string *)(local_290 + 8),paVar4->lex,(allocator *)local_250);
      local_268 = -1;
      IrSim::icNoOp((InterCode *)local_230,&irSim,0xd,(C_OP *)local_290);
      IrSim::commitIc(&irSim,(InterCode *)local_230);
      if (local_1c0._M_p != local_1b0) {
        operator_delete(local_1c0._M_p);
      }
      if (local_1f0._M_p != local_1e0) {
        operator_delete(local_1f0._M_p);
      }
      if (local_220._M_p != local_210) {
        operator_delete(local_220._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      for (; (paVar2 != (ast *)0x0 && (paVar2->type == -0x2706)); paVar2 = child(paVar2,3)) {
        paVar3 = child(paVar2,1);
        paVar3 = child(paVar3,2);
        pcVar5 = TR_VarDec(paVar3,(int *)0x0);
        local_290._0_4_ = 1;
        std::__cxx11::string::string((string *)(local_290 + 8),pcVar5,(allocator *)local_250);
        local_268 = -1;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&irSim.argSet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_290 + 8));
        IrSim::icNoOp((InterCode *)local_230,&irSim,0x11,(C_OP *)local_290);
        IrSim::commitIc(&irSim,(InterCode *)local_230);
        if (local_1c0._M_p != local_1b0) {
          operator_delete(local_1c0._M_p);
        }
        if (local_1f0._M_p != local_1e0) {
          operator_delete(local_1f0._M_p);
        }
        if (local_220._M_p != local_210) {
          operator_delete(local_220._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
      }
      paVar2 = child(local_260,3);
      TR_CompSt(paVar2);
      paVar2 = child(local_258,2);
    } while (paVar2 != (ast *)0x0);
  }
  IrSim::optimize(&irSim);
  pcVar5 = output_file;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,".ir","");
  strlen(pcVar5);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,(ulong)pcVar5);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    local_288._M_string_length = *psVar7;
    local_288.field_2._M_allocated_capacity = plVar6[3];
    local_290 = (undefined1  [8])(local_290 + 0x10);
  }
  else {
    local_288._M_string_length = *psVar7;
    local_290 = (undefined1  [8])*plVar6;
  }
  local_288._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::ofstream::ofstream(local_230,(string *)local_290,_S_out);
  if (local_290 != (undefined1  [8])(local_290 + 0x10)) {
    operator_delete((void *)local_290);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    IrSim::printStream(&irSim,(ostream *)local_230);
    std::ofstream::close();
  }
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void genIR() {
#if COMPILER_VERSION >= 3
    ast *node = child(ast_root, 1);
    while (node && node->type != NullNode) {
        ast *ext = child(node, 1), *func = child(ext, 2), *id = child(func, 1), *var = child(func, 3);
        if (func->type != FunDec)
            IMP_ME("Global definition or structure");
        irSim << irSim.icFunction(id->lex);
        while (var && var->type == VarList) {
            irSim << irSim.icParam(TR_VarDec(child(child(var, 1), 2)));
            var = child(var, 3);
        }
        TR_CompSt(child(ext, 3));
        node = child(node, 2);
    }
//    irSim.printStream(cout);
#if COMPILER_VERSION == 3
    ofstream out(output_file + string(".orig.ir"));
    if (out.is_open()) {
        irSim.printStream(out);
        out.close();
    }
#endif

    irSim.optimize();

#if COMPILER_VERSION == 3
    out.open(output_file);
#elif COMPILER_VERSION > 3
    ofstream out(output_file + string(".ir"));
#endif
    if (out.is_open()) {
        irSim.printStream(out);
        out.close();
    }
#if COMPILER_VERSION == 3
    else {
        cerr << "ERROR: Cannot open " << output_file << endl;
    }
#endif

#endif
}